

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O3

void __thiscall
ThreadedReplayer::enqueue_parent_pipeline<ThreadedReplayer::DeferredComputeInfo>
          (ThreadedReplayer *this,DeferredComputeInfo *info,Hash h,
          unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
          *pipelines,
          unordered_map<unsigned_long,_ThreadedReplayer::DeferredComputeInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>_>
          *parents,unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *parsed_parents)

{
  int iVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  __hashtable *__h;
  __node_gen_type __node_gen;
  Hash local_68;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_60;
  PipelineWorkItem local_58;
  
  if (h != 0) {
    local_68 = h;
    cVar2 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&pipelines->_M_h,&local_68);
    if (cVar2.super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>.
        _M_cur == (__node_type *)0x0) {
      cVar3 = std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&parsed_parents->_M_h,&local_68);
      if (cVar3.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0) {
        iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->hash_lock);
        if (iVar1 != 0) {
          std::__throw_system_error(iVar1);
        }
        cVar4 = std::
                _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&parents->_M_h,&local_68);
        pthread_mutex_unlock((pthread_mutex_t *)&this->hash_lock);
        if (cVar4.
            super__Node_iterator_base<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>,_false>
            ._M_cur == (__node_type *)0x0) {
          local_58.create_info.graphics_create_info = (VkGraphicsPipelineCreateInfo *)0x0;
          local_58.output.pipeline = (VkPipeline *)0x0;
          local_58.hash_map_entry.pipeline = (VkPipeline *)0x0;
          local_58.index = info->index;
          local_58.hash = local_68;
          local_58.parse_only = true;
          local_58.force_outside_range = true;
          local_58.memory_context_index = 2;
          local_58.tag = RESOURCE_COMPUTE_PIPELINE;
          enqueue_work_item(this,&local_58);
          local_60 = parsed_parents;
          std::
          _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                    ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)parsed_parents,&local_68);
        }
      }
    }
  }
  return;
}

Assistant:

void enqueue_parent_pipeline(const DerivedInfo &info, Hash h,
	                             const unordered_map<Hash, VkPipeline> &pipelines,
	                             unordered_map<Hash, DerivedInfo> &parents,
	                             unordered_set<Hash> &parsed_parents)
	{
		if (!h)
			return;

		// pipelines will have an entry if we called enqueue_pipeline() already for this hash,
		// it's not necessarily complete yet!
		bool is_outside_range = pipelines.count(h) == 0;

		if (is_outside_range && parsed_parents.count(h) == 0)
		{
			{
				lock_guard<mutex> holder(hash_lock);
				if (parents.count(h) != 0)
					return;
			}

			PipelineWorkItem work_item;
			work_item.index = info.index;
			work_item.hash = h;
			work_item.parse_only = true;
			work_item.force_outside_range = true;
			work_item.memory_context_index = PARENT_PIPELINE_MEMORY_CONTEXT;
			work_item.tag = DerivedInfo::get_tag();
			enqueue_work_item(work_item);

			parsed_parents.insert(h);
		}
	}